

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<unsigned_long>::setCapacity(Vector<unsigned_long> *this,size_t newSize)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  RemoveConst<unsigned_long> *pRVar3;
  unsigned_long *__dest;
  ulong __n;
  ArrayBuilder<unsigned_long> newBuilder;
  ArrayBuilder<unsigned_long> local_38;
  
  puVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)puVar1 >> 3)) {
    (this->builder).pos = puVar1 + newSize;
  }
  __dest = (unsigned_long *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  puVar1 = (this->builder).ptr;
  puVar2 = (this->builder).pos;
  local_38.ptr = __dest;
  if (puVar1 != puVar2) {
    __n = (long)puVar2 - (long)puVar1 & 0xfffffffffffffff8;
    local_38.pos = __dest;
    memcpy(__dest,puVar1,__n);
    __dest = (unsigned_long *)((long)__dest + __n);
  }
  local_38.pos = __dest;
  ArrayBuilder<unsigned_long>::operator=(&this->builder,&local_38);
  puVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  puVar1 = local_38.ptr;
  if (local_38.ptr != (unsigned_long *)0x0) {
    local_38.ptr = (unsigned_long *)0x0;
    local_38.pos = (RemoveConst<unsigned_long> *)0x0;
    local_38.endPtr = (unsigned_long *)0x0;
    (*(code *)**(undefined8 **)local_38.disposer)
              (local_38.disposer,puVar1,8,(long)pRVar3 - (long)puVar1 >> 3,
               (long)puVar2 - (long)puVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }